

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

ValueHolder *
testing::internal::
CheckedDowncastToActualType<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
          (ThreadLocalValueHolderBase *base)

{
  bool bVar1;
  ValueHolder *pVVar2;
  undefined8 uVar3;
  GTestLog local_14;
  
  if (base != (ThreadLocalValueHolderBase *)0x0) {
    bVar1 = std::type_info::operator==
                      ((type_info *)base->_vptr_ThreadLocalValueHolderBase[-1],
                       (type_info *)
                       &ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder::
                        typeinfo);
    if (!bVar1) {
      GTestLog::GTestLog(&local_14,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/inani47[P]8-puzzle-BFS/vendor/googletest/googletest/include/gtest/internal/gtest-port.h"
                         ,0x578);
      std::operator<<((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ");
      GTestLog::~GTestLog(&local_14);
    }
    pVVar2 = (ValueHolder *)
             __dynamic_cast(base,&ThreadLocalValueHolderBase::typeinfo,
                            &ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder::
                             typeinfo,0);
    return pVVar2;
  }
  uVar3 = __cxa_bad_typeid();
  GTestLog::~GTestLog(&local_14);
  _Unwind_Resume(uVar3);
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}